

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_suite.cpp
# Opt level: O0

void api_suite::api_push_front_iterator(void)

{
  circular_view<int,4ul> *this;
  initializer_list<int> __l;
  undefined4 local_9c;
  size_type local_98 [2];
  int *local_88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  allocator<int> local_61;
  int local_60 [2];
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> input;
  circular_array<int,_4UL> data;
  
  vista::circular_array<int,_4UL>::circular_array
            ((circular_array<int,_4UL> *)
             &input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  local_60[0] = 0xb;
  local_60[1] = 0x16;
  local_58 = local_60;
  local_50 = 2;
  std::allocator<int>::allocator(&local_61);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,__l,&local_61);
  std::allocator<int>::~allocator(&local_61);
  this = (circular_view<int,4ul> *)(data.super_array<int,_4UL>._M_elems + 2);
  local_80._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_48);
  local_88 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)local_48);
  vista::circular_view<int,4ul>::
  push_front<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (this,local_80,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_88);
  local_98[0] = vista::circular_view<int,_4UL>::size((circular_view<int,_4UL> *)this);
  local_9c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0xba,"void api_suite::api_push_front_iterator()",local_98,&local_9c);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  return;
}

Assistant:

void api_push_front_iterator()
{
    circular_array<int, 4> data;
    std::vector<int> input = { 11, 22 };
    data.push_front(input.begin(), input.end());
    BOOST_TEST_EQ(data.size(), 2);
}